

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall
cmExtraEclipseCDT4Generator::WriteGroups
          (cmExtraEclipseCDT4Generator *this,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups,string *linkName,
          cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppcVar3;
  bool bVar4;
  string *psVar5;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  size_type sVar6;
  cmSourceGroup *pcVar7;
  pointer ppcVar8;
  string linkName4;
  string linkName3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  string local_d0;
  cmXMLWriter *local_b0;
  string local_a8;
  string local_88;
  string *local_68;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_60;
  cmExtraEclipseCDT4Generator *local_48;
  cmSourceGroup *local_40;
  cmSourceGroup *local_38;
  
  pcVar7 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
           .super__Vector_impl_data._M_start;
  local_40 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar7 != local_40) {
    paVar1 = &local_88.field_2;
    local_b0 = xml;
    local_68 = linkName;
    local_48 = this;
    do {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      pcVar2 = (local_68->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + local_68->_M_string_length);
      std::__cxx11::string::append((char *)&local_a8);
      psVar5 = cmSourceGroup::GetFullName_abi_cxx11_(pcVar7);
      std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(psVar5->_M_dataplus)._M_p);
      if (local_a8._M_string_length != 0) {
        sVar6 = 0;
        do {
          if (local_a8._M_dataplus._M_p[sVar6] == '\\') {
            local_a8._M_dataplus._M_p[sVar6] = '/';
          }
          sVar6 = sVar6 + 1;
        } while (local_a8._M_string_length != sVar6);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"virtual:/virtual","");
      AppendLinkedResource(local_b0,&local_a8,&local_d0,VirtualFolder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      sourceGroups_00 = cmSourceGroup::GetGroupChildren(pcVar7);
      if ((sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        WriteGroups(local_48,sourceGroups_00,local_68,local_b0);
      }
      local_38 = pcVar7;
      __x = cmSourceGroup::GetSourceFiles(pcVar7);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                (&local_60,__x);
      ppcVar3 = local_60.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar8 = local_60.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppcVar8 != ppcVar3;
          ppcVar8 = ppcVar8 + 1) {
        psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar8);
        bVar4 = cmsys::SystemTools::FileIsDirectory(psVar5);
        if (!bVar4) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_a8._M_dataplus._M_p,
                     local_a8._M_dataplus._M_p + local_a8._M_string_length);
          std::__cxx11::string::append((char *)&local_d0);
          cmsys::SystemTools::GetFilenameName(&local_88,psVar5);
          std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_88._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          pcVar2 = (psVar5->_M_dataplus)._M_p;
          local_88._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar2,pcVar2 + psVar5->_M_string_length);
          AppendLinkedResource(local_b0,&local_d0,&local_88,LinkToFile);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (local_60.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar7 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != local_40);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::WriteGroups(
  std::vector<cmSourceGroup> const& sourceGroups, std::string& linkName,
  cmXMLWriter& xml)
{
  for (cmSourceGroup const& sg : sourceGroups) {
    std::string linkName3 = linkName;
    linkName3 += "/";
    linkName3 += sg.GetFullName();

    std::replace(linkName3.begin(), linkName3.end(), '\\', '/');

    cmExtraEclipseCDT4Generator::AppendLinkedResource(
      xml, linkName3, "virtual:/virtual", VirtualFolder);
    std::vector<cmSourceGroup> const& children = sg.GetGroupChildren();
    if (!children.empty()) {
      this->WriteGroups(children, linkName, xml);
    }
    std::vector<const cmSourceFile*> sFiles = sg.GetSourceFiles();
    for (cmSourceFile const* file : sFiles) {
      std::string const& fullPath = file->GetFullPath();

      if (!cmSystemTools::FileIsDirectory(fullPath)) {
        std::string linkName4 = linkName3;
        linkName4 += "/";
        linkName4 += cmSystemTools::GetFilenameName(fullPath);
        cmExtraEclipseCDT4Generator::AppendLinkedResource(
          xml, linkName4,
          cmExtraEclipseCDT4Generator::GetEclipsePath(fullPath), LinkToFile);
      }
    }
  }
}